

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blendshape_fitting.hpp
# Opt level: O2

vector<float,_std::allocator<float>_> *
eos::fitting::fit_blendshapes_to_landmarks_nnls
          (vector<float,_std::allocator<float>_> *__return_storage_ptr__,
          vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>
          *blendshapes,VectorXf *face_instance,Matrix<float,_3,_4,_0,_3,_4> *affine_camera_matrix,
          vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
          *landmarks,vector<int,_std::allocator<int>_> *vertex_ids)

{
  Scalar SVar1;
  float fVar2;
  pointer pBVar3;
  pointer pBVar4;
  undefined1 auVar5 [16];
  ulong uVar6;
  Scalar *pSVar7;
  Scalar *pSVar8;
  CoeffReturnType pfVar9;
  long lVar10;
  ulong uVar11;
  long row;
  long lVar12;
  int i;
  int y_1;
  long col;
  VectorXf coefficients;
  ColVectorType local_238;
  VectorXf v_bar;
  VectorXf y;
  MatrixXf V_hat_h;
  vector<Eigen::Triplet<float,_int>,_std::allocator<Eigen::Triplet<float,_int>_>_> P_coefficients;
  MatrixXf A;
  MatrixXf blendshapes_as_basis;
  MatrixXf b;
  SparseMatrix<float,_0,_int> P;
  NNLS<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> nnls;
  PlainObjectBase<Eigen::Matrix<float,_1,_1,0,_1,_1>> *local_40 [2];
  
  uVar11 = (long)(landmarks->
                 super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(landmarks->
                 super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 3;
  if (uVar11 == (long)(vertex_ids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(vertex_ids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_start >> 2) {
    pBVar3 = (blendshapes->
             super__Vector_base<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    pBVar4 = (blendshapes->
             super__Vector_base<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>
             )._M_impl.super__Vector_impl_data._M_start;
    morphablemodel::to_matrix(&blendshapes_as_basis,blendshapes);
    lVar10 = (long)((int)uVar11 * 4);
    Eigen::DenseBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::Zero
              ((ConstantReturnType *)&nnls,lVar10,((long)pBVar3 - (long)pBVar4) / 0x30);
    Eigen::PlainObjectBase<Eigen::Matrix<float,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,_1,0,_1,_1>>>
              ((PlainObjectBase<Eigen::Matrix<float,_1,_1,0,_1,_1>> *)&V_hat_h,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>
                *)&nnls);
    lVar12 = 0;
    uVar6 = 0;
    if (0 < (int)uVar11) {
      uVar6 = uVar11 & 0xffffffff;
    }
    for (; uVar6 * 4 != lVar12; lVar12 = lVar12 + 4) {
      Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>::Block
                ((Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false> *)&nnls,
                 &blendshapes_as_basis,
                 (long)*(int *)((long)(vertex_ids->super__Vector_base<int,_std::allocator<int>_>).
                                      _M_impl.super__Vector_impl_data._M_start + lVar12) * 3,0,3,
                 blendshapes_as_basis.
                 super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_cols);
      Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>::Block
                ((Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false> *)&P,&V_hat_h,lVar12
                 ,0,3,V_hat_h.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.
                      m_storage.m_cols);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>,_1,_1,false>,Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>const,_1,_1,false>>
                ((Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false> *)&P,
                 (Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false> *)&nnls);
    }
    lVar12 = (long)(uVar11 * 0x300000000) >> 0x20;
    Eigen::SparseMatrix<float,_0,_int>::SparseMatrix(&P,lVar12,lVar10);
    P_coefficients.
    super__Vector_base<Eigen::Triplet<float,_int>,_std::allocator<Eigen::Triplet<float,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    P_coefficients.
    super__Vector_base<Eigen::Triplet<float,_int>,_std::allocator<Eigen::Triplet<float,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    P_coefficients.
    super__Vector_base<Eigen::Triplet<float,_int>,_std::allocator<Eigen::Triplet<float,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    for (uVar11 = 0; uVar11 != uVar6; uVar11 = uVar11 + 1) {
      for (row = 0; row != 3; row = row + 1) {
        for (col = 0; col != 4; col = col + 1) {
          pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>,_1>::operator()
                             ((DenseCoeffsBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>,_1> *)
                              affine_camera_matrix,row,col);
          auVar5 = (undefined1  [16])nnls._0_16_;
          nnls._num_ls = (uint)col | (int)uVar11 * 4;
          nnls._max_iter = (int)row + (int)uVar11 * 3;
          nnls._Np._4_4_ = auVar5._12_4_;
          nnls._Np._0_4_ = *pSVar7;
          std::vector<Eigen::Triplet<float,int>,std::allocator<Eigen::Triplet<float,int>>>::
          emplace_back<Eigen::Triplet<float,int>>
                    ((vector<Eigen::Triplet<float,int>,std::allocator<Eigen::Triplet<float,int>>> *)
                     &P_coefficients,(Triplet<float,_int> *)&nnls);
        }
      }
    }
    nnls._0_8_ = P_coefficients.
                 super__Vector_base<Eigen::Triplet<float,_int>,_std::allocator<Eigen::Triplet<float,_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    A.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_data =
         (float *)P_coefficients.
                  super__Vector_base<Eigen::Triplet<float,_int>,_std::allocator<Eigen::Triplet<float,_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
    Eigen::SparseMatrix<float,0,int>::
    setFromTriplets<__gnu_cxx::__normal_iterator<Eigen::Triplet<float,int>*,std::vector<Eigen::Triplet<float,int>,std::allocator<Eigen::Triplet<float,int>>>>>
              ((SparseMatrix<float,0,int> *)&P,
               (__normal_iterator<Eigen::Triplet<float,_int>_*,_std::vector<Eigen::Triplet<float,_int>,_std::allocator<Eigen::Triplet<float,_int>_>_>_>
                *)&nnls,(__normal_iterator<Eigen::Triplet<float,_int>_*,_std::vector<Eigen::Triplet<float,_int>,_std::allocator<Eigen::Triplet<float,_int>_>_>_>
                         *)&A);
    Eigen::DenseBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::Ones
              ((DenseBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)&nnls,lVar12);
    Eigen::PlainObjectBase<Eigen::Matrix<float,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,_1,1>>>
              ((PlainObjectBase<Eigen::Matrix<float,_1,1,0,_1,1>> *)&y,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
                *)&nnls);
    lVar12 = 0;
    for (uVar11 = 0; uVar6 != uVar11; uVar11 = uVar11 + 1) {
      SVar1 = (landmarks->
              super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
              )._M_impl.super__Vector_impl_data._M_start[uVar11].
              super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0];
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_1> *)&y,lVar12);
      *pSVar8 = SVar1;
      SVar1 = *(float *)((long)&(landmarks->
                                super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                                )._M_impl.super__Vector_impl_data._M_start[uVar11].
                                super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.
                                m_storage.m_data + 4);
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_1> *)&y,lVar12 + 1
                         );
      *pSVar8 = SVar1;
      lVar12 = lVar12 + 3;
    }
    Eigen::DenseBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::Ones
              ((DenseBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)&nnls,lVar10);
    Eigen::PlainObjectBase<Eigen::Matrix<float,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,_1,1>>>
              ((PlainObjectBase<Eigen::Matrix<float,_1,1,0,_1,1>> *)&v_bar,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
                *)&nnls);
    for (lVar10 = 0; uVar6 * 4 != lVar10; lVar10 = lVar10 + 4) {
      pfVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0> *)face_instance
                          ,(long)*(int *)((long)(vertex_ids->
                                                super__Vector_base<int,_std::allocator<int>_>).
                                                _M_impl.super__Vector_impl_data._M_start + lVar10) *
                           3);
      fVar2 = *pfVar9;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_1> *)&v_bar,lVar10
                         );
      *pSVar8 = fVar2;
      pfVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0> *)face_instance
                          ,(long)*(int *)((long)(vertex_ids->
                                                super__Vector_base<int,_std::allocator<int>_>).
                                                _M_impl.super__Vector_impl_data._M_start + lVar10) *
                           3 + 1);
      fVar2 = *pfVar9;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_1> *)&v_bar,
                          lVar10 + 1);
      *pSVar8 = fVar2;
      pfVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0> *)face_instance
                          ,(long)*(int *)((long)(vertex_ids->
                                                super__Vector_base<int,_std::allocator<int>_>).
                                                _M_impl.super__Vector_impl_data._M_start + lVar10) *
                           3 + 2);
      fVar2 = *pfVar9;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_1> *)&v_bar,
                          lVar10 + 2);
      *pSVar8 = fVar2;
    }
    nnls._0_16_ = Eigen::SparseMatrixBase<Eigen::SparseMatrix<float,0,int>>::operator*
                            ((SparseMatrixBase<Eigen::SparseMatrix<float,0,int>> *)&P,
                             (MatrixBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)&V_hat_h);
    Eigen::PlainObjectBase<Eigen::Matrix<float,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::Product<Eigen::SparseMatrix<float,0,int>,Eigen::Matrix<float,_1,_1,0,_1,_1>,0>>
              ((PlainObjectBase<Eigen::Matrix<float,_1,_1,0,_1,_1>> *)&A,
               (DenseBase<Eigen::Product<Eigen::SparseMatrix<float,_0,_int>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0>_>
                *)&nnls);
    coefficients.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage =
         (PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>)
         Eigen::SparseMatrixBase<Eigen::SparseMatrix<float,0,int>>::operator*
                   ((SparseMatrixBase<Eigen::SparseMatrix<float,0,int>> *)&P,
                    (MatrixBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)&v_bar);
    Eigen::
    MatrixBase<Eigen::Product<Eigen::SparseMatrix<float,0,int>,Eigen::Matrix<float,-1,1,0,-1,1>,0>>
    ::operator-((CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Product<Eigen::SparseMatrix<float,_0,_int>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
                 *)&nnls,(MatrixBase<Eigen::Product<Eigen::SparseMatrix<float,0,int>,Eigen::Matrix<float,_1,1,0,_1,1>,0>>
                          *)&coefficients,(MatrixBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)&y);
    Eigen::PlainObjectBase<Eigen::Matrix<float,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,float>,Eigen::Product<Eigen::SparseMatrix<float,0,int>,Eigen::Matrix<float,_1,1,0,_1,1>,0>const,Eigen::Matrix<float,_1,1,0,_1,1>const>>
              ((PlainObjectBase<Eigen::Matrix<float,_1,_1,0,_1,_1>> *)&b,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Product<Eigen::SparseMatrix<float,_0,_int>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
                *)&nnls);
    coefficients.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage =
         (PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>)ZEXT816(0);
    Eigen::NNLS<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::NNLS(&nnls,&A,100,1e-10);
    local_40[0] = (PlainObjectBase<Eigen::Matrix<float,_1,_1,0,_1,_1>> *)&b;
    Eigen::PlainObjectBase<Eigen::Matrix<float,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,Eigen::Matrix<float,_1,_1,0,_1,_1>const>>
              ((PlainObjectBase<Eigen::Matrix<float,_1,1,0,_1,1>> *)&local_238,
               (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>
                *)local_40);
    Eigen::NNLS<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::solve(&nnls,&local_238,MAX_DESCENT);
    free(local_238.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    local_238.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (float *)&coefficients;
    Eigen::NoAlias<Eigen::Matrix<float,-1,1,0,-1,1>,Eigen::MatrixBase>::operator=
              ((NoAlias<Eigen::Matrix<float,_1,1,0,_1,1>,Eigen::MatrixBase> *)&local_238,
               (MatrixBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)&nnls._x);
    std::vector<float,std::allocator<float>>::vector<float*,void>
              ((vector<float,std::allocator<float>> *)__return_storage_ptr__,
               coefficients.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.
               m_data,coefficients.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.
                      m_storage.m_data +
                      coefficients.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.
                      m_storage.m_rows,(allocator_type *)&local_238);
    Eigen::NNLS<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::~NNLS(&nnls);
    free(coefficients.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_data
        );
    free(b.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_data);
    free(A.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_data);
    free(v_bar.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    free(y.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    std::_Vector_base<Eigen::Triplet<float,_int>,_std::allocator<Eigen::Triplet<float,_int>_>_>::
    ~_Vector_base(&P_coefficients.
                   super__Vector_base<Eigen::Triplet<float,_int>,_std::allocator<Eigen::Triplet<float,_int>_>_>
                 );
    Eigen::SparseMatrix<float,_0,_int>::~SparseMatrix(&P);
    free(V_hat_h.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_data);
    free(blendshapes_as_basis.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.
         m_storage.m_data);
    return __return_storage_ptr__;
  }
  __assert_fail("landmarks.size() == vertex_ids.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/include/eos/fitting/blendshape_fitting.hpp"
                ,0x8f,
                "std::vector<float> eos::fitting::fit_blendshapes_to_landmarks_nnls(const std::vector<morphablemodel::Blendshape> &, const Eigen::VectorXf &, Eigen::Matrix<float, 3, 4>, const std::vector<Eigen::Vector2f> &, const std::vector<int> &)"
               );
}

Assistant:

inline std::vector<float> fit_blendshapes_to_landmarks_nnls(
    const std::vector<morphablemodel::Blendshape>& blendshapes, const Eigen::VectorXf& face_instance,
    Eigen::Matrix<float, 3, 4> affine_camera_matrix, const std::vector<Eigen::Vector2f>& landmarks,
    const std::vector<int>& vertex_ids)
{
    assert(landmarks.size() == vertex_ids.size());

    using Eigen::MatrixXf;
    using Eigen::VectorXf;

    const auto num_blendshapes = blendshapes.size();
    const int num_landmarks = static_cast<int>(landmarks.size());

    // Copy all blendshapes into a "basis" matrix with each blendshape being a column:
    const MatrixXf blendshapes_as_basis = morphablemodel::to_matrix(blendshapes);

    // $\hat{V} \in R^{3N\times m-1}$, subselect the rows of the eigenvector matrix $V$ associated with the $N$ feature points
    // And we insert a row of zeros after every third row, resulting in matrix $\hat{V}_h \in R^{4N\times m-1}$:
    MatrixXf V_hat_h = MatrixXf::Zero(4 * num_landmarks, num_blendshapes);
    int row_index = 0;
    for (int i = 0; i < num_landmarks; ++i)
    {
        V_hat_h.block(row_index, 0, 3, V_hat_h.cols()) =
            blendshapes_as_basis.block(vertex_ids[i] * 3, 0, 3, blendshapes_as_basis.cols());
        row_index += 4; // replace 3 rows and skip the 4th one, it has all zeros
    }

    // Form a block diagonal matrix $P \in R^{3N\times 4N}$ in which the camera matrix C (P_Affine, affine_camera_matrix) is placed on the diagonal:
    Eigen::SparseMatrix<float> P(3 * num_landmarks, 4 * num_landmarks);
    std::vector<Eigen::Triplet<float>> P_coefficients; // list of non-zeros coefficients
    for (int i = 0; i < num_landmarks; ++i)
    { // Note: could make this the inner-most loop.
        for (int x = 0; x < affine_camera_matrix.rows(); ++x)
        {
            for (int y = 0; y < affine_camera_matrix.cols(); ++y)
            {
                P_coefficients.push_back(
                    Eigen::Triplet<float>(3 * i + x, 4 * i + y, affine_camera_matrix(x, y)));
            }
        }
    }
    P.setFromTriplets(P_coefficients.begin(), P_coefficients.end());

    // The landmarks in matrix notation (in homogeneous coordinates), $3N\times 1$
    VectorXf y = VectorXf::Ones(3 * num_landmarks);
    for (int i = 0; i < num_landmarks; ++i)
    {
        y(3 * i) = landmarks[i][0];
        y((3 * i) + 1) = landmarks[i][1];
        // y_((3 * i) + 2) = 1; // already 1, stays (homogeneous coordinate)
    }

    // The mean, with an added homogeneous coordinate (x_1, y_1, z_1, 1, x_2, ...)^t
    VectorXf v_bar = VectorXf::Ones(4 * num_landmarks);
    for (int i = 0; i < num_landmarks; ++i)
    {
        v_bar(4 * i) = face_instance(vertex_ids[i] * 3);
        v_bar((4 * i) + 1) = face_instance(vertex_ids[i] * 3 + 1);
        v_bar((4 * i) + 2) = face_instance(vertex_ids[i] * 3 + 2);
        // v_bar((4 * i) + 3) = 1; // already 1, stays (homogeneous coordinate)
    }

    // Bring into standard least squares form:
    const MatrixXf A = P * V_hat_h;   // camera matrix times the basis
    const MatrixXf b = P * v_bar - y; // camera matrix times the mean, minus the landmarks

    // Solve using NNLS:
    VectorXf coefficients;
    Eigen::NNLS<MatrixXf> nnls(A, 100); // In the multi-image fitting, the solver sometimes got stuck. This limits it to 100 iterations. It normaly converges within <10 iterations. This should be fine for the single-image fitting as well.
    bool non_singular = nnls.solve(-b);
    coefficients.noalias() = nnls.x();

    return std::vector<float>(coefficients.data(), coefficients.data() + coefficients.size());
}